

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O2

void scp_reply_data(SftpReplyBuilder *srb,ptrlen data)

{
  SftpReplyBuilderVtable *pSVar1;
  
  *(undefined1 *)&srb[-0xf].vt = 0;
  safefree(srb[-2].vt);
  pSVar1 = (SftpReplyBuilderVtable *)mkstr(data);
  srb[-2].vt = pSVar1;
  srb[-1].vt = (SftpReplyBuilderVtable *)data.len;
  return;
}

Assistant:

static void scp_reply_data(SftpReplyBuilder *srb, ptrlen data)
{
    ScpReplyReceiver *reply = container_of(srb, ScpReplyReceiver, srb);
    char *p;
    reply->err = false;
    sfree((void *)reply->data.ptr);
    reply->data.ptr = p = mkstr(data);
    reply->data.len = data.len;
}